

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  Parameter *pPVar1;
  CompilerMSL *this_00;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  BuiltIn builtin;
  uint32_t uVar6;
  SPIRVariable *pSVar7;
  SPIRType *pSVar8;
  SPIRType *pSVar9;
  SPIRType *pSVar10;
  size_type sVar11;
  char *pcVar12;
  size_type sVar13;
  char (*ts_1) [2];
  byte bVar14;
  uint uVar15;
  int iVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ID id;
  byte bVar17;
  bool bVar18;
  string local_e8;
  byte local_c1;
  Parameter *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  CompilerMSL *local_98;
  SPIRVariable *local_90;
  ulong local_88;
  string address_space;
  string local_50;
  
  pSVar7 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,(arg->id).id);
  pSVar8 = Compiler::get_variable_data_type((Compiler *)this,pSVar7);
  pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(arg->type).id);
  local_88 = (ulong)pSVar9->storage;
  uVar6 = (pSVar7->super_IVariant).self.id;
  id.id = (pSVar7->basevariable).id;
  if (id.id == 0) {
    id.id = uVar6;
  }
  bVar17 = arg->alias_global_variable;
  if ((bool)bVar17 == false) {
    id.id = uVar6;
  }
  bVar18 = pSVar9->pointer;
  uVar6 = arg->write_count;
  local_c0 = arg;
  local_98 = this;
  local_90 = pSVar7;
  bVar3 = type_is_msl_framebuffer_fetch(this,pSVar8);
  bVar4 = ~(bVar3 | bVar17) & uVar6 == 0 & bVar18;
  iVar16 = *(int *)&(pSVar8->super_IVariant).field_0xc;
  uVar15 = iVar16 - 0x10;
  bVar14 = uVar15 < 3 | bVar4;
  if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    bVar14 = bVar4;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c1 = bVar18;
  if (bVar14 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bVar17 = local_c0->alias_global_variable;
    iVar16 = *(int *)&(pSVar8->super_IVariant).field_0xc;
  }
  uVar2 = local_88;
  pSVar7 = local_90;
  this_00 = local_98;
  bVar18 = false;
  if ((((bVar17 & 1) == 0) && (iVar16 == 0x11)) && ((pSVar8->image).dim == Dim2D)) {
    pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)local_98,(pSVar8->image).type.id);
    if (*(int *)&(pSVar10->super_IVariant).field_0xc - 0xcU < 3) {
      address_space._M_dataplus._M_p._0_4_ = 0x39;
      sVar11 = ::std::
               set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
               ::count(&this_00->spv_function_implementations,(key_type *)&address_space);
      bVar18 = sVar11 != 0;
    }
    else {
      bVar18 = false;
    }
  }
  iVar16 = (int)uVar2;
  get_argument_address_space_abi_cxx11_(&address_space,this_00,pSVar7);
  bVar3 = Compiler::is_builtin_variable((Compiler *)this_00,pSVar7);
  this_00->is_using_builtin_array = bVar3;
  bVar5 = ::std::operator==(&address_space,"threadgroup");
  pPVar1 = local_c0;
  if (bVar5) {
    this_00->is_using_builtin_array = true;
  }
  uVar6 = (local_90->basevariable).id;
  if ((uVar6 == 0) ||
     ((uVar6 != (this_00->stage_in_ptr_var_id).id && (uVar6 != (this_00->stage_out_ptr_var_id).id)))
     ) {
    if (bVar3) {
      builtin = Compiler::get_decoration
                          ((Compiler *)this_00,(ID)(local_c0->id).id,DecorationBuiltIn);
      builtin_type_decl_abi_cxx11_(&local_e8,this_00,builtin,(pPVar1->id).id);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      goto LAB_002a3158;
    }
    if (((iVar16 != 0xc) && (iVar16 != 2)) ||
       (bVar5 = Compiler::is_array((Compiler *)this_00,pSVar8), !bVar5)) {
      if (bVar18) {
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,(pSVar8->image).type.id);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler;
        (**(code **)((long)&in_R8[4].field_2 + 8))(&local_b8,this_00,pSVar10,0);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  (&local_e8,(spirv_cross *)"spvDynamicImageSampler<",(char (*) [24])&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x310a41,
                   (char (*) [2])in_R8);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_e8);
        ::std::__cxx11::string::~string((string *)&local_b8);
        Compiler::set_extended_decoration
                  ((Compiler *)this_00,(local_c0->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
        goto LAB_002a3162;
      }
      (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_e8,this_00,pSVar8,(ulong)(local_c0->id).id);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      goto LAB_002a3158;
    }
    this_00->is_using_builtin_array = true;
    ts_1 = (char (*) [2])(ulong)(local_c0->id).id;
    (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_b8,this_00,pSVar8);
    join<std::__cxx11::string,char_const(&)[2]>
              (&local_e8,(spirv_cross *)&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x310d8e,ts_1);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_e8);
    this_01 = &local_b8;
  }
  else {
    (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&local_e8,this_00,pSVar8,(ulong)(local_c0->id).id);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_002a3158:
    this_01 = &local_e8;
  }
  ::std::__cxx11::string::~string((string *)this_01);
LAB_002a3162:
  if (((bVar3 || iVar16 == 0) || ((local_c1 & 1) != 0)) || (iVar16 - 9U < 0xfffffffe)) {
    bVar18 = Compiler::is_array((Compiler *)this_00,pSVar8);
    if ((uVar15 < 3) || (!bVar18)) {
      if (iVar16 == 0) {
        if (address_space._M_string_length != 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    (&local_e8,(spirv_cross *)&address_space,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b65a,
                     (char (*) [2])__return_storage_ptr__,in_R8);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
          ::std::__cxx11::string::~string((string *)&local_e8);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this_00->super_CompilerGLSL,id.id,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        if (address_space._M_string_length != 0) {
          if ((__return_storage_ptr__->_M_dataplus)._M_p
              [__return_storage_ptr__->_M_string_length - 1] == '*') {
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (&local_e8,(spirv_cross *)0x30b65a,(char (*) [2])&address_space,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b65a
                       ,(char (*) [2])in_R8);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          else {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&local_e8,(spirv_cross *)&address_space,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b65a
                       ,(char (*) [2])__return_storage_ptr__,in_R8);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
          }
          ::std::__cxx11::string::~string((string *)&local_e8);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_restrict(this_00,id.id,true);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this_00->super_CompilerGLSL,id.id,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
    }
    else {
      if (address_space._M_string_length != 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_e8,(spirv_cross *)&address_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b65a,
                   (char (*) [2])__return_storage_ptr__,in_R8);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
        ::std::__cxx11::string::~string((string *)&local_e8);
      }
      if (((((this_00->msl_options).argument_buffers == true) &&
           ((uVar6 = Compiler::get_decoration((Compiler *)this_00,id,DecorationDescriptorSet),
            iVar16 == 0xc || (iVar16 == 2)))) && (uVar6 < 8)) &&
         (((this_00->msl_options).argument_buffers != false &&
          ((this_00->argument_buffer_discrete_mask >> (uVar6 & 0x1f) & 1) == 0)))) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar12 = to_restrict(this_00,id.id,true);
      if (*pcVar12 != '\0') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this_00->super_CompilerGLSL,id.id,true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_e8,this_00,pSVar8)
      ;
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  else if (((this_00->msl_options).force_native_arrays == true) &&
          (bVar18 = Compiler::is_array((Compiler *)this_00,pSVar8), bVar18)) {
    ::std::__cxx11::string::string((string *)&local_b8,"thread const ",(allocator *)&local_50);
    ::std::operator+(&local_e8,&local_b8,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_b8);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar12 = to_restrict(this_00,id.id,true);
    if (*pcVar12 != '\0') {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this_00->super_CompilerGLSL,id.id,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_e8,this_00,pSVar8);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    if (address_space._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_e8,(spirv_cross *)&address_space,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b65a,
                 (char (*) [2])__return_storage_ptr__,in_R8);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
      ::std::__cxx11::string::~string((string *)&local_e8);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    CompilerGLSL::to_expression_abi_cxx11_(&local_e8,&this_00->super_CompilerGLSL,id.id,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&local_e8);
  pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this_00,id.id);
  if (pSVar7 != (SPIRVariable *)0x0) {
    local_e8._M_dataplus._M_p._0_4_ = (pSVar7->super_IVariant).self.id;
    sVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this_00->atomic_image_vars)._M_h,(key_type *)&local_e8);
    if (sVar13 != 0) {
      pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,(pSVar9->image).type.id);
      (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_b8,this_00,pSVar8,0);
      ::std::operator+(&local_e8,", device atomic_",&local_b8);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this_00->super_CompilerGLSL,id.id,true);
      ::std::operator+(&local_b8,"* ",&local_50);
      ::std::operator+(&local_e8,&local_b8,"_atomic");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  this_00->is_using_builtin_array = false;
  ::std::__cxx11::string::~string((string *)&address_space);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// Arrays of images/samplers in MSL are always const.
	if (!type.array.empty() && type_is_image)
		constref = true;

	string decl;
	if (constref)
		decl += "const ";

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = is_builtin_variable(var);
	is_using_builtin_array = builtin;
	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl += type_to_glsl(type, arg.id);
	else if (builtin)
		decl += builtin_type_decl(static_cast<BuiltIn>(get_decoration(arg.id, DecorationBuiltIn)), arg.id);
	else if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl += join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
		decl += type_to_glsl(type, arg.id);

	bool opaque_handle = storage == StorageClassUniformConstant;

	if (!builtin && !opaque_handle && !is_pointer &&
	    (storage == StorageClassFunction || storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of images and samplers are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		if (msl_options.argument_buffers)
		{
			uint32_t desc_set = get_decoration(name_id, DecorationDescriptorSet);
			if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) &&
			    descriptor_set_is_argument_buffer(desc_set))
			{
				// An awkward case where we need to emit *more* address space declarations (yay!).
				// An example is where we pass down an array of buffer pointers to leaf functions.
				// It's a constant array containing pointers to constants.
				// The pointer array is always constant however. E.g.
				// device SSBO * constant (&array)[N].
				// const device SSBO * constant (&array)[N].
				// constant SSBO * constant (&array)[N].
				// However, this only matters for argument buffers, since for MSL 1.0 style codegen,
				// we emit the buffer array on stack instead, and that seems to work just fine apparently.

				// If the argument was marked as being in device address space, any pointer to member would
				// be const device, not constant.
				if (argument_buffer_device_storage_mask & (1u << desc_set))
					decl += " const device";
				else
					decl += " constant";
			}
		}

		decl += " (&";
		const char *restrict_kw = to_restrict(name_id);
		if (*restrict_kw)
		{
			decl += " ";
			decl += restrict_kw;
		}
		decl += to_expression(name_id);
		decl += ")";
		decl += type_to_array_glsl(type);
	}
	else if (!opaque_handle)
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (decl.back() == '*')
				decl += join(" ", address_space, " ");
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id);
		decl += to_expression(name_id);
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}